

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMdisk.cpp
# Opt level: O0

void ReportBuildOptions(void)

{
  initializer_list<const_char_*> __l;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  LogHelper *h;
  char local_61;
  char **local_60;
  char **o;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  allocator<const_char_*> local_29;
  char *local_28;
  char *local_20;
  iterator local_18;
  size_type local_10;
  
  if (ReportBuildOptions()::options == '\0') {
    iVar2 = __cxa_guard_acquire(&ReportBuildOptions()::options);
    if (iVar2 != 0) {
      local_28 = "zlib";
      local_20 = "lzma";
      local_18 = &local_28;
      local_10 = 2;
      std::allocator<const_char_*>::allocator(&local_29);
      __l._M_len = local_10;
      __l._M_array = local_18;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&ReportBuildOptions::options,__l,&local_29);
      std::allocator<const_char_*>::~allocator(&local_29);
      __cxa_atexit(std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector,
                   &ReportBuildOptions::options,&__dso_handle);
      __cxa_guard_release(&ReportBuildOptions()::options);
    }
  }
  sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                    (&ReportBuildOptions::options);
  if (sVar3 != 0) {
    util::operator<<((LogHelper *)&util::cout,(char (*) [18])"\nBuild features:\n");
    __end2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                       (&ReportBuildOptions::options);
    o = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                           (&ReportBuildOptions::options);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                  *)&o);
      if (!bVar1) break;
      local_60 = __gnu_cxx::
                 __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                 ::operator*(&__end2);
      local_61 = ' ';
      h = util::operator<<((LogHelper *)&util::cout,&local_61);
      util::operator<<(h,local_60);
      __gnu_cxx::
      __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
      ::operator++(&__end2);
    }
    util::operator<<((LogHelper *)&util::cout,(char (*) [2])0x2a74b6);
  }
  return;
}

Assistant:

void ReportBuildOptions()
{
    static const std::vector<const char*> options{
#ifdef HAVE_ZLIB
        "zlib",
#endif
#ifdef HAVE_BZIP2
        "bzip2",
#endif
#ifdef HAVE_LZMA
        "lzma",
#endif
#ifdef HAVE_WINUSB
        "WinUSB",
#endif
#ifdef HAVE_LIBUSB1
        "libusb1",
#endif
#ifdef HAVE_FTDI
        "FTDI",
#endif
#ifdef HAVE_FTD2XX
        "FTD2XX",
#endif
#ifdef HAVE_CAPSIMAGE
        "CAPSimage",
#endif
#ifdef HAVE_FDRAWCMD_H
        "fdrawcmd.sys",
#endif
    };

    if (options.size())
    {
        util::cout << "\nBuild features:\n";
        for (const auto& o : options)
            util::cout << ' ' << o;
        util::cout << "\n";
    }
}